

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O2

ostream * pstore::repo::operator<<(ostream *os,section_kind kind)

{
  ostream *poVar1;
  
  if (kind < last) {
    poVar1 = std::operator<<(os,&DAT_001414d0 + *(int *)(&DAT_001414d0 + (ulong)kind * 4));
    return poVar1;
  }
  poVar1 = std::operator<<(os,"unknown section_kind");
  return poVar1;
}

Assistant:

std::ostream & operator<< (std::ostream & os, section_kind const kind) {
            auto str = "unknown section_kind";
#define X(a)                                                                                       \
    case section_kind::a: str = #a; break;
            switch (kind) {
                PSTORE_MCREPO_SECTION_KINDS
            case section_kind::last: break;
            }
            return os << str;
#undef X
        }